

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPLayer.cpp
# Opt level: O3

void __thiscall TCPLayer::notifyRead(TCPLayer *this)

{
  Buffer *pBVar1;
  int *piVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  PacketHandler *pPVar6;
  uint3 uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  char c;
  char incomingData [1024];
  char local_441;
  vector<char,_std::allocator<char>_> local_440;
  char local_428 [1024];
  
  memset(local_428,0,0x400);
  if (this->gotSize == false) {
    pBVar1 = &this->incomingPacket;
    iVar10 = Buffer::getSize(pBVar1);
    iVar10 = TCPSocket::receive(&this->socket,local_428,4 - iVar10);
    Buffer::append(pBVar1,local_428,(long)iVar10);
    iVar10 = Buffer::getSize(pBVar1);
    if (iVar10 == 4) {
      pcVar9 = Buffer::getData(pBVar1);
      cVar3 = *pcVar9;
      pcVar9 = Buffer::getData(pBVar1);
      cVar4 = pcVar9[1];
      pcVar9 = Buffer::getData(pBVar1);
      cVar5 = pcVar9[2];
      pcVar9 = Buffer::getData(pBVar1);
      uVar7 = CONCAT12(cVar5,CONCAT11(cVar4,cVar3));
      this->incomingPacketSize =
           (uint)(byte)pcVar9[3] | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
           CONCAT13(pcVar9[3],uVar7) << 0x18;
      Buffer::consume(pBVar1,4);
      this->gotSize = true;
    }
  }
  else {
    iVar10 = this->incomingPacketSize;
    pBVar1 = &this->incomingPacket;
    iVar8 = Buffer::getSize(pBVar1);
    iVar10 = iVar10 - iVar8;
    if (0x3ff < iVar10) {
      iVar10 = 0x400;
    }
    iVar10 = TCPSocket::receive(&this->socket,local_428,iVar10);
    Buffer::append(pBVar1,local_428,(long)iVar10);
    piVar2 = &this->incomingPacketSize;
    *piVar2 = *piVar2 - iVar10;
    if (*piVar2 == 0) {
      local_441 = '\0';
      Buffer::append(pBVar1,&local_441,1);
      this->incomingPacketSize = 0;
      this->gotSize = false;
      pPVar6 = this->upperLayer;
      std::vector<char,_std::allocator<char>_>::vector(&local_440,&pBVar1->data);
      (**pPVar6->_vptr_PacketHandler)(pPVar6,&local_440);
      if (local_440.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_440.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar10 = Buffer::getSize(pBVar1);
      Buffer::consume(pBVar1,(long)iVar10);
    }
  }
  return;
}

Assistant:

void TCPLayer::notifyRead() {
    char incomingData[1024] = {0};


    if(!gotSize){
        int howManyBytesCanBeRead = sizeof(int) - incomingPacket.getSize();

        int readBytes = socket.receive(incomingData, howManyBytesCanBeRead);

        incomingPacket.append(incomingData, readBytes);

        if(incomingPacket.getSize() == sizeof(int)){
            char sizeBytes[sizeof(int)] = {0};
            sizeBytes[0] = incomingPacket.getData()[0];
            sizeBytes[1] = incomingPacket.getData()[1];
            sizeBytes[2] = incomingPacket.getData()[2];
            sizeBytes[3] = incomingPacket.getData()[3];

            int size = *(reinterpret_cast<int*>(sizeBytes));

            incomingPacketSize = ntohl(size);

            incomingPacket.consume(sizeof(int));
            gotSize = true;
        }
    }
    else{
        int howManyBytesCanBeRead = incomingPacketSize - incomingPacket.getSize();
        if(howManyBytesCanBeRead > 1024){
            howManyBytesCanBeRead = 1024;
        }

        int readBytes = socket.receive(incomingData, howManyBytesCanBeRead);

        incomingPacket.append(incomingData, readBytes);
        incomingPacketSize -= readBytes;

        if(incomingPacketSize == 0){
            char c = 0;
            incomingPacket.append(&c, 1);

            incomingPacketSize = 0;
            gotSize = false;

            upperLayer->handlePacket(incomingPacket);
            incomingPacket.consume(incomingPacket.getSize());
        }
    }

}